

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<8,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  float fVar8;
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  AABBNodeMB4D *node1;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined4 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  uint uVar45;
  vfloat4 a0;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vint8 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2680 [32];
  undefined1 (*local_2660) [16];
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined4 local_2560;
  undefined4 uStack_255c;
  undefined4 uStack_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined4 local_2540;
  undefined4 uStack_253c;
  undefined4 uStack_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  undefined4 local_2520;
  undefined4 uStack_251c;
  undefined4 uStack_2518;
  undefined4 uStack_2514;
  undefined4 uStack_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  float local_23e0 [4];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [16];
  undefined1 local_23b0 [16];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar36 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar40 = vrsqrtss_avx(auVar36,auVar36);
    fVar44 = auVar40._0_4_;
    local_24c0 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uStack_24bc = local_24c0;
    uStack_24b8 = local_24c0;
    uStack_24b4 = local_24c0;
    uStack_24b0 = local_24c0;
    uStack_24ac = local_24c0;
    uStack_24a8 = local_24c0;
    uStack_24a4 = local_24c0;
    local_24e0 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    uStack_24dc = local_24e0;
    uStack_24d8 = local_24e0;
    uStack_24d4 = local_24e0;
    uStack_24d0 = local_24e0;
    uStack_24cc = local_24e0;
    uStack_24c8 = local_24e0;
    uStack_24c4 = local_24e0;
    local_23e0[0] = fVar44 * 1.5 - auVar36._0_4_ * 0.5 * fVar44 * fVar44 * fVar44;
    local_2500 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_24fc = local_2500;
    fStack_24f8 = local_2500;
    fStack_24f4 = local_2500;
    fStack_24f0 = local_2500;
    fStack_24ec = local_2500;
    fStack_24e8 = local_2500;
    fStack_24e4 = local_2500;
    auVar46._0_4_ = aVar2.x * local_23e0[0];
    auVar46._4_4_ = aVar2.y * local_23e0[0];
    auVar46._8_4_ = aVar2.z * local_23e0[0];
    auVar46._12_4_ = aVar2.field_3.w * local_23e0[0];
    auVar40 = vshufpd_avx(auVar46,auVar46,1);
    auVar35._8_4_ = 0x80000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar35._12_4_ = 0x80000000;
    auVar36 = vmovshdup_avx(auVar46);
    auVar50._12_4_ = 0;
    auVar50._0_12_ = ZEXT812(0);
    auVar50 = auVar50 << 0x20;
    auVar58 = vunpckhps_avx(auVar46,auVar50);
    auVar47 = vshufps_avx(auVar58,ZEXT416(auVar36._0_4_ ^ 0x80000000),0x41);
    auVar58._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar58._8_8_ = auVar40._8_8_ ^ auVar35._8_8_;
    auVar58 = vinsertps_avx(auVar58,auVar46,0x2a);
    auVar36 = vdpps_avx(auVar47,auVar47,0x7f);
    auVar40 = vdpps_avx(auVar58,auVar58,0x7f);
    auVar36 = vcmpps_avx(auVar40,auVar36,1);
    auVar62._0_4_ = auVar36._0_4_;
    auVar62._4_4_ = auVar62._0_4_;
    auVar62._8_4_ = auVar62._0_4_;
    auVar62._12_4_ = auVar62._0_4_;
    auVar36 = vblendvps_avx(auVar58,auVar47,auVar62);
    auVar40 = vdpps_avx(auVar36,auVar36,0x7f);
    auVar58 = vrsqrtss_avx(auVar40,auVar40);
    fVar44 = auVar58._0_4_;
    fVar44 = fVar44 * 1.5 - auVar40._0_4_ * 0.5 * fVar44 * fVar44 * fVar44;
    auVar55._0_4_ = auVar36._0_4_ * fVar44;
    auVar55._4_4_ = auVar36._4_4_ * fVar44;
    auVar55._8_4_ = auVar36._8_4_ * fVar44;
    auVar55._12_4_ = auVar36._12_4_ * fVar44;
    auVar36 = vshufps_avx(auVar55,auVar55,0xc9);
    auVar40 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar60._0_4_ = auVar40._0_4_ * auVar55._0_4_;
    auVar60._4_4_ = auVar40._4_4_ * auVar55._4_4_;
    auVar60._8_4_ = auVar40._8_4_ * auVar55._8_4_;
    auVar60._12_4_ = auVar40._12_4_ * auVar55._12_4_;
    auVar36 = vfmsub231ps_fma(auVar60,auVar46,auVar36);
    auVar58 = vshufps_avx(auVar36,auVar36,0xc9);
    auVar36 = vdpps_avx(auVar58,auVar58,0x7f);
    auVar40 = vrsqrtss_avx(auVar36,auVar36);
    fVar44 = auVar40._0_4_;
    fVar44 = fVar44 * 1.5 - fVar44 * fVar44 * fVar44 * auVar36._0_4_ * 0.5;
    auVar40._0_4_ = auVar58._0_4_ * fVar44;
    auVar40._4_4_ = auVar58._4_4_ * fVar44;
    auVar40._8_4_ = auVar58._8_4_ * fVar44;
    auVar40._12_4_ = auVar58._12_4_ * fVar44;
    auVar36._0_4_ = local_23e0[0] * auVar46._0_4_;
    auVar36._4_4_ = local_23e0[0] * auVar46._4_4_;
    auVar36._8_4_ = local_23e0[0] * auVar46._8_4_;
    auVar36._12_4_ = local_23e0[0] * auVar46._12_4_;
    auVar58 = vunpcklps_avx(auVar55,auVar36);
    auVar36 = vunpckhps_avx(auVar55,auVar36);
    auVar47 = vunpcklps_avx(auVar40,auVar50);
    auVar40 = vunpckhps_avx(auVar40,auVar50);
    local_23b0 = vunpcklps_avx(auVar36,auVar40);
    local_23d0 = vunpcklps_avx(auVar58,auVar47);
    local_23c0 = vunpckhps_avx(auVar58,auVar47);
    uStack_2398 = 0;
    auVar40 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar58 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar47._8_4_ = 0x7fffffff;
    auVar47._0_8_ = 0x7fffffff7fffffff;
    auVar47._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx((undefined1  [16])aVar2,auVar47);
    auVar56._8_4_ = 0x219392ef;
    auVar56._0_8_ = 0x219392ef219392ef;
    auVar56._12_4_ = 0x219392ef;
    auVar36 = vcmpps_avx(auVar36,auVar56,1);
    auVar36 = vblendvps_avx((undefined1  [16])aVar2,auVar56,auVar36);
    auVar47 = vrcpps_avx(auVar36);
    auVar51._8_4_ = 0x3f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    auVar51._12_4_ = 0x3f800000;
    auVar36 = vfnmadd231ps_fma(auVar51,auVar47,auVar36);
    local_2520 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uStack_251c = local_2520;
    uStack_2518 = local_2520;
    uStack_2514 = local_2520;
    uStack_2510 = local_2520;
    uStack_250c = local_2520;
    uStack_2508 = local_2520;
    uStack_2504 = local_2520;
    local_2540 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uStack_253c = local_2540;
    uStack_2538 = local_2540;
    uStack_2534 = local_2540;
    uStack_2530 = local_2540;
    uStack_252c = local_2540;
    uStack_2528 = local_2540;
    uStack_2524 = local_2540;
    auVar35 = vfmadd132ps_fma(auVar36,auVar47,auVar47);
    local_2560 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uStack_255c = local_2560;
    uStack_2558 = local_2560;
    uStack_2554 = local_2560;
    uStack_2550 = local_2560;
    uStack_254c = local_2560;
    uStack_2548 = local_2560;
    uStack_2544 = local_2560;
    fVar44 = auVar35._0_4_;
    local_2580._4_4_ = fVar44;
    local_2580._0_4_ = fVar44;
    local_2580._8_4_ = fVar44;
    local_2580._12_4_ = fVar44;
    local_2580._16_4_ = fVar44;
    local_2580._20_4_ = fVar44;
    local_2580._24_4_ = fVar44;
    local_2580._28_4_ = fVar44;
    auVar59 = ZEXT3264(local_2580);
    auVar36 = vmovshdup_avx(auVar35);
    uVar33 = auVar36._0_8_;
    local_25a0._8_8_ = uVar33;
    local_25a0._0_8_ = uVar33;
    local_25a0._16_8_ = uVar33;
    local_25a0._24_8_ = uVar33;
    auVar61 = ZEXT3264(local_25a0);
    auVar47 = vshufpd_avx(auVar35,auVar35,1);
    auVar50 = vshufps_avx(auVar35,auVar35,0xaa);
    uVar33 = auVar50._0_8_;
    local_25c0._8_8_ = uVar33;
    local_25c0._0_8_ = uVar33;
    local_25c0._16_8_ = uVar33;
    local_25c0._24_8_ = uVar33;
    auVar65 = ZEXT3264(local_25c0);
    auVar52._0_4_ = fVar44 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar52._4_4_ = auVar35._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar52._8_4_ = auVar35._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar52._12_4_ = auVar35._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    uVar30 = (ulong)(fVar44 < 0.0) * 0x20;
    uVar32 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
    auVar36 = vmovshdup_avx(auVar52);
    auVar50 = vshufps_avx(auVar52,auVar52,0xaa);
    uVar31 = (ulong)(auVar47._0_4_ < 0.0) << 5 | 0x80;
    uVar41 = auVar40._0_4_;
    local_25e0._4_4_ = uVar41;
    local_25e0._0_4_ = uVar41;
    local_25e0._8_4_ = uVar41;
    local_25e0._12_4_ = uVar41;
    local_25e0._16_4_ = uVar41;
    local_25e0._20_4_ = uVar41;
    local_25e0._24_4_ = uVar41;
    local_25e0._28_4_ = uVar41;
    auVar66 = ZEXT3264(local_25e0);
    uVar41 = auVar58._0_4_;
    auVar34 = ZEXT3264(CONCAT428(uVar41,CONCAT424(uVar41,CONCAT420(uVar41,CONCAT416(uVar41,CONCAT412
                                                  (uVar41,CONCAT48(uVar41,CONCAT44(uVar41,uVar41))))
                                                  ))));
    uVar27 = CONCAT44(auVar52._0_4_,auVar52._0_4_);
    local_2600._0_8_ = uVar27 ^ 0x8000000080000000;
    local_2600._8_4_ = -auVar52._0_4_;
    local_2600._12_4_ = -auVar52._0_4_;
    local_2600._16_4_ = -auVar52._0_4_;
    local_2600._20_4_ = -auVar52._0_4_;
    local_2600._24_4_ = -auVar52._0_4_;
    local_2600._28_4_ = -auVar52._0_4_;
    auVar57 = ZEXT3264(local_2600);
    uVar21 = auVar36._0_4_;
    uVar45 = auVar36._4_4_;
    local_2620._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
    local_2620._8_4_ = uVar21 ^ 0x80000000;
    local_2620._12_4_ = uVar45 ^ 0x80000000;
    local_2620._16_4_ = uVar21 ^ 0x80000000;
    local_2620._20_4_ = uVar45 ^ 0x80000000;
    local_2620._24_4_ = uVar21 ^ 0x80000000;
    local_2620._28_4_ = uVar45 ^ 0x80000000;
    auVar67 = ZEXT3264(local_2620);
    uVar21 = auVar50._0_4_;
    uVar45 = auVar50._4_4_;
    local_2640._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
    local_2640._8_4_ = uVar21 ^ 0x80000000;
    local_2640._12_4_ = uVar45 ^ 0x80000000;
    local_2640._16_4_ = uVar21 ^ 0x80000000;
    local_2640._20_4_ = uVar45 ^ 0x80000000;
    local_2640._24_4_ = uVar21 ^ 0x80000000;
    local_2640._28_4_ = uVar45 ^ 0x80000000;
    auVar69 = ZEXT3264(local_2640);
    local_2660 = (undefined1 (*) [16])local_2390;
LAB_01509167:
    if (local_2660 != (undefined1 (*) [16])&local_23a0) {
      pauVar29 = local_2660 + -1;
      local_2660 = local_2660 + -1;
      if (*(float *)(*pauVar29 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar27 = *(ulong *)*local_2660;
        pauVar29 = local_2660;
        while ((uVar27 & 8) == 0) {
          fVar44 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar21 = (uint)uVar27 & 7;
          uVar25 = uVar27 & 0xfffffffffffffff0;
          if (uVar21 == 3) {
            local_2440 = *(undefined1 (*) [32])(uVar25 + 0x40);
            local_2400 = *(undefined1 (*) [32])(uVar25 + 0x60);
            pauVar1 = (undefined1 (*) [32])(uVar25 + 0x80);
            local_2660 = (undefined1 (*) [16])*(undefined8 *)*pauVar1;
            uStack_2658 = *(undefined8 *)(uVar25 + 0x88);
            uStack_2650 = *(undefined8 *)(uVar25 + 0x90);
            uStack_2648 = *(undefined8 *)(uVar25 + 0x98);
            local_2460 = *(undefined1 (*) [32])(uVar25 + 0xa0);
            local_2420 = *(undefined1 (*) [32])(uVar25 + 0xc0);
            local_2480 = *(undefined1 (*) [32])(uVar25 + 0xe0);
            auVar10 = *(undefined1 (*) [32])(uVar25 + 0x100);
            auVar11 = *(undefined1 (*) [32])(uVar25 + 0x120);
            auVar12 = *(undefined1 (*) [32])(uVar25 + 0x140);
            fVar8 = 1.0 - fVar44;
            auVar70._4_4_ = fVar8;
            auVar70._0_4_ = fVar8;
            auVar70._8_4_ = fVar8;
            auVar70._12_4_ = fVar8;
            auVar70._16_4_ = fVar8;
            auVar70._20_4_ = fVar8;
            auVar70._24_4_ = fVar8;
            auVar70._28_4_ = fVar8;
            local_24a0._0_4_ = fVar44 * *(float *)(uVar25 + 0x1c0);
            local_24a0._4_4_ = fVar44 * *(float *)(uVar25 + 0x1c4);
            local_24a0._8_4_ = fVar44 * *(float *)(uVar25 + 0x1c8);
            local_24a0._12_4_ = fVar44 * *(float *)(uVar25 + 0x1cc);
            local_24a0._16_4_ = fVar44 * *(float *)(uVar25 + 0x1d0);
            local_24a0._20_4_ = fVar44 * *(float *)(uVar25 + 0x1d4);
            local_24a0._24_4_ = fVar44 * *(float *)(uVar25 + 0x1d8);
            local_24a0._28_4_ = 0;
            auVar4._4_4_ = fStack_24fc * auVar10._4_4_;
            auVar4._0_4_ = local_2500 * auVar10._0_4_;
            auVar4._8_4_ = fStack_24f8 * auVar10._8_4_;
            auVar4._12_4_ = fStack_24f4 * auVar10._12_4_;
            auVar4._16_4_ = fStack_24f0 * auVar10._16_4_;
            auVar4._20_4_ = fStack_24ec * auVar10._20_4_;
            auVar4._24_4_ = fStack_24e8 * auVar10._24_4_;
            auVar4._28_4_ = 0;
            auVar53._0_4_ = local_2500 * auVar11._0_4_;
            auVar53._4_4_ = fStack_24fc * auVar11._4_4_;
            auVar53._8_4_ = fStack_24f8 * auVar11._8_4_;
            auVar53._12_4_ = fStack_24f4 * auVar11._12_4_;
            auVar53._16_4_ = fStack_24f0 * auVar11._16_4_;
            auVar53._20_4_ = fStack_24ec * auVar11._20_4_;
            auVar53._24_4_ = fStack_24e8 * auVar11._24_4_;
            auVar53._28_4_ = 0;
            auVar19._4_4_ = uStack_24dc;
            auVar19._0_4_ = local_24e0;
            auVar19._8_4_ = uStack_24d8;
            auVar19._12_4_ = uStack_24d4;
            auVar19._16_4_ = uStack_24d0;
            auVar19._20_4_ = uStack_24cc;
            auVar19._24_4_ = uStack_24c8;
            auVar19._28_4_ = uStack_24c4;
            auVar36 = vfmadd231ps_fma(auVar4,auVar19,local_2460);
            auVar40 = vfmadd231ps_fma(auVar53,auVar19,local_2420);
            auVar20._4_4_ = uStack_24bc;
            auVar20._0_4_ = local_24c0;
            auVar20._8_4_ = uStack_24b8;
            auVar20._12_4_ = uStack_24b4;
            auVar20._16_4_ = uStack_24b0;
            auVar20._20_4_ = uStack_24ac;
            auVar20._24_4_ = uStack_24a8;
            auVar20._28_4_ = uStack_24a4;
            auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar20,local_2440);
            auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar20,local_2400);
            auVar68._8_4_ = 0x7fffffff;
            auVar68._0_8_ = 0x7fffffff7fffffff;
            auVar68._12_4_ = 0x7fffffff;
            auVar68._16_4_ = 0x7fffffff;
            auVar68._20_4_ = 0x7fffffff;
            auVar68._24_4_ = 0x7fffffff;
            auVar68._28_4_ = 0x7fffffff;
            auVar4 = vandps_avx(auVar68,ZEXT1632(auVar36));
            auVar63._8_4_ = 0x219392ef;
            auVar63._0_8_ = 0x219392ef219392ef;
            auVar63._12_4_ = 0x219392ef;
            auVar63._16_4_ = 0x219392ef;
            auVar63._20_4_ = 0x219392ef;
            auVar63._24_4_ = 0x219392ef;
            auVar63._28_4_ = 0x219392ef;
            auVar4 = vcmpps_avx(auVar4,auVar63,1);
            auVar5 = vblendvps_avx(ZEXT1632(auVar36),auVar63,auVar4);
            auVar4 = vandps_avx(auVar68,ZEXT1632(auVar40));
            auVar4 = vcmpps_avx(auVar4,auVar63,1);
            auVar53 = vblendvps_avx(ZEXT1632(auVar40),auVar63,auVar4);
            auVar6._4_4_ = fStack_24fc * auVar12._4_4_;
            auVar6._0_4_ = local_2500 * auVar12._0_4_;
            auVar6._8_4_ = fStack_24f8 * auVar12._8_4_;
            auVar6._12_4_ = fStack_24f4 * auVar12._12_4_;
            auVar6._16_4_ = fStack_24f0 * auVar12._16_4_;
            auVar6._20_4_ = fStack_24ec * auVar12._20_4_;
            auVar6._24_4_ = fStack_24e8 * auVar12._24_4_;
            auVar6._28_4_ = auVar4._28_4_;
            auVar36 = vfmadd231ps_fma(auVar6,auVar19,local_2480);
            auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar20,*pauVar1);
            auVar4 = vandps_avx(auVar68,ZEXT1632(auVar36));
            auVar6 = vcmpps_avx(auVar4,auVar63,1);
            auVar4 = vblendvps_avx(ZEXT1632(auVar36),auVar63,auVar6);
            auVar7._4_4_ = fVar44 * *(float *)(uVar25 + 0x1e4);
            auVar7._0_4_ = fVar44 * *(float *)(uVar25 + 0x1e0);
            auVar7._8_4_ = fVar44 * *(float *)(uVar25 + 0x1e8);
            auVar7._12_4_ = fVar44 * *(float *)(uVar25 + 0x1ec);
            auVar7._16_4_ = fVar44 * *(float *)(uVar25 + 0x1f0);
            auVar7._20_4_ = fVar44 * *(float *)(uVar25 + 500);
            auVar7._24_4_ = fVar44 * *(float *)(uVar25 + 0x1f8);
            auVar7._28_4_ = fStack_24e4;
            auVar35 = vfmadd231ps_fma(local_24a0,auVar70,ZEXT832(0) << 0x20);
            auVar46 = vfmadd231ps_fma(auVar7,auVar70,ZEXT832(0) << 0x20);
            auVar13._4_4_ = fVar44 * *(float *)(uVar25 + 0x204);
            auVar13._0_4_ = fVar44 * *(float *)(uVar25 + 0x200);
            auVar13._8_4_ = fVar44 * *(float *)(uVar25 + 0x208);
            auVar13._12_4_ = fVar44 * *(float *)(uVar25 + 0x20c);
            auVar13._16_4_ = fVar44 * *(float *)(uVar25 + 0x210);
            auVar13._20_4_ = fVar44 * *(float *)(uVar25 + 0x214);
            auVar13._24_4_ = fVar44 * *(float *)(uVar25 + 0x218);
            auVar13._28_4_ = uStack_24c4;
            auVar51 = vfmadd231ps_fma(auVar13,auVar70,ZEXT832(0) << 0x20);
            auVar54._0_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x220);
            auVar54._4_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x224);
            auVar54._8_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x228);
            auVar54._12_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x22c);
            auVar54._16_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x230);
            auVar54._20_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x234);
            auVar54._24_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x238);
            auVar54._28_4_ = fVar8 + auVar6._28_4_;
            auVar49._0_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x240);
            auVar49._4_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x244);
            auVar49._8_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x248);
            auVar49._12_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x24c);
            auVar49._16_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x250);
            auVar49._20_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x254);
            auVar49._24_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 600);
            auVar49._28_4_ = fVar8 + 0.0;
            auVar6 = vrcpps_avx(auVar5);
            auVar71._0_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x260);
            auVar71._4_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x264);
            auVar71._8_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x268);
            auVar71._12_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x26c);
            auVar71._16_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x270);
            auVar71._20_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x274);
            auVar71._24_4_ = fVar8 + fVar44 * *(float *)(uVar25 + 0x278);
            auVar71._28_4_ = fVar8 + 0.0;
            auVar7 = vrcpps_avx(auVar53);
            auVar64._8_4_ = 0x3f800000;
            auVar64._0_8_ = 0x3f8000003f800000;
            auVar64._12_4_ = 0x3f800000;
            auVar64._16_4_ = 0x3f800000;
            auVar64._20_4_ = 0x3f800000;
            auVar64._24_4_ = 0x3f800000;
            auVar64._28_4_ = 0x3f800000;
            auVar36 = vfnmadd213ps_fma(auVar5,auVar6,auVar64);
            auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar6,auVar6);
            auVar40 = vfnmadd213ps_fma(auVar53,auVar7,auVar64);
            auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar7,auVar7);
            auVar5 = vrcpps_avx(auVar4);
            auVar58 = vfnmadd213ps_fma(auVar4,auVar5,auVar64);
            auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar5,auVar5);
            auVar5._4_4_ = uStack_255c;
            auVar5._0_4_ = local_2560;
            auVar5._8_4_ = uStack_2558;
            auVar5._12_4_ = uStack_2554;
            auVar5._16_4_ = uStack_2550;
            auVar5._20_4_ = uStack_254c;
            auVar5._24_4_ = uStack_2548;
            auVar5._28_4_ = uStack_2544;
            auVar47 = vfmadd213ps_fma(auVar10,auVar5,*(undefined1 (*) [32])(uVar25 + 0x160));
            auVar10._4_4_ = uStack_253c;
            auVar10._0_4_ = local_2540;
            auVar10._8_4_ = uStack_2538;
            auVar10._12_4_ = uStack_2534;
            auVar10._16_4_ = uStack_2530;
            auVar10._20_4_ = uStack_252c;
            auVar10._24_4_ = uStack_2528;
            auVar10._28_4_ = uStack_2524;
            auVar52 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar10,local_2460);
            auVar65 = ZEXT3264(local_25c0);
            auVar47 = vfmadd213ps_fma(auVar11,auVar5,*(undefined1 (*) [32])(uVar25 + 0x180));
            auVar50 = vfmadd213ps_fma(auVar12,auVar5,*(undefined1 (*) [32])(uVar25 + 0x1a0));
            auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar10,local_2420);
            auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar10,local_2480);
            auVar11._4_4_ = uStack_251c;
            auVar11._0_4_ = local_2520;
            auVar11._8_4_ = uStack_2518;
            auVar11._12_4_ = uStack_2514;
            auVar11._16_4_ = uStack_2510;
            auVar11._20_4_ = uStack_250c;
            auVar11._24_4_ = uStack_2508;
            auVar11._28_4_ = uStack_2504;
            auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar11,local_2440);
            auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar11,local_2400);
            auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar11,*pauVar1);
            auVar10 = vsubps_avx(ZEXT1632(auVar35),ZEXT1632(auVar52));
            auVar61 = ZEXT3264(local_25a0);
            auVar11 = vsubps_avx(auVar54,ZEXT1632(auVar52));
            auVar12 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar47));
            auVar4 = vsubps_avx(auVar49,ZEXT1632(auVar47));
            auVar5 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar50));
            auVar53 = vsubps_avx(auVar71,ZEXT1632(auVar50));
            auVar14._4_4_ = auVar36._4_4_ * auVar10._4_4_;
            auVar14._0_4_ = auVar36._0_4_ * auVar10._0_4_;
            auVar14._8_4_ = auVar36._8_4_ * auVar10._8_4_;
            auVar14._12_4_ = auVar36._12_4_ * auVar10._12_4_;
            auVar14._16_4_ = auVar10._16_4_ * 0.0;
            auVar14._20_4_ = auVar10._20_4_ * 0.0;
            auVar14._24_4_ = auVar10._24_4_ * 0.0;
            auVar14._28_4_ = auVar10._28_4_;
            auVar15._4_4_ = auVar36._4_4_ * auVar11._4_4_;
            auVar15._0_4_ = auVar36._0_4_ * auVar11._0_4_;
            auVar15._8_4_ = auVar36._8_4_ * auVar11._8_4_;
            auVar15._12_4_ = auVar36._12_4_ * auVar11._12_4_;
            auVar15._16_4_ = auVar11._16_4_ * 0.0;
            auVar15._20_4_ = auVar11._20_4_ * 0.0;
            auVar15._24_4_ = auVar11._24_4_ * 0.0;
            auVar15._28_4_ = auVar11._28_4_;
            auVar66 = ZEXT3264(local_25e0);
            auVar16._4_4_ = auVar40._4_4_ * auVar12._4_4_;
            auVar16._0_4_ = auVar40._0_4_ * auVar12._0_4_;
            auVar16._8_4_ = auVar40._8_4_ * auVar12._8_4_;
            auVar16._12_4_ = auVar40._12_4_ * auVar12._12_4_;
            auVar16._16_4_ = auVar12._16_4_ * 0.0;
            auVar16._20_4_ = auVar12._20_4_ * 0.0;
            auVar16._24_4_ = auVar12._24_4_ * 0.0;
            auVar16._28_4_ = auVar12._28_4_;
            auVar12._4_4_ = auVar58._4_4_ * auVar5._4_4_;
            auVar12._0_4_ = auVar58._0_4_ * auVar5._0_4_;
            auVar12._8_4_ = auVar58._8_4_ * auVar5._8_4_;
            auVar12._12_4_ = auVar58._12_4_ * auVar5._12_4_;
            auVar12._16_4_ = auVar5._16_4_ * 0.0;
            auVar12._20_4_ = auVar5._20_4_ * 0.0;
            auVar12._24_4_ = auVar5._24_4_ * 0.0;
            auVar12._28_4_ = auVar5._28_4_;
            auVar17._4_4_ = auVar40._4_4_ * auVar4._4_4_;
            auVar17._0_4_ = auVar40._0_4_ * auVar4._0_4_;
            auVar17._8_4_ = auVar40._8_4_ * auVar4._8_4_;
            auVar17._12_4_ = auVar40._12_4_ * auVar4._12_4_;
            auVar17._16_4_ = auVar4._16_4_ * 0.0;
            auVar17._20_4_ = auVar4._20_4_ * 0.0;
            auVar17._24_4_ = auVar4._24_4_ * 0.0;
            auVar17._28_4_ = auVar4._28_4_;
            auVar67 = ZEXT3264(local_2620);
            auVar18._4_4_ = auVar58._4_4_ * auVar53._4_4_;
            auVar18._0_4_ = auVar58._0_4_ * auVar53._0_4_;
            auVar18._8_4_ = auVar58._8_4_ * auVar53._8_4_;
            auVar18._12_4_ = auVar58._12_4_ * auVar53._12_4_;
            auVar18._16_4_ = auVar53._16_4_ * 0.0;
            auVar18._20_4_ = auVar53._20_4_ * 0.0;
            auVar18._24_4_ = auVar53._24_4_ * 0.0;
            auVar18._28_4_ = auVar53._28_4_;
            auVar69 = ZEXT3264(local_2640);
            auVar10 = vpminsd_avx2(auVar16,auVar17);
            auVar11 = vpminsd_avx2(auVar12,auVar18);
            auVar10 = vmaxps_avx(auVar10,auVar11);
            auVar5 = vpminsd_avx2(auVar14,auVar15);
            auVar4 = vpmaxsd_avx2(auVar14,auVar15);
            auVar11 = vpmaxsd_avx2(auVar16,auVar17);
            auVar12 = vpmaxsd_avx2(auVar12,auVar18);
            auVar12 = vminps_avx(auVar11,auVar12);
            auVar11 = vmaxps_avx(local_25e0,auVar5);
            auVar59 = ZEXT3264(local_2580);
            local_2680 = vmaxps_avx(auVar11,auVar10);
            auVar57 = ZEXT3264(local_2600);
            auVar10 = vminps_avx(auVar34._0_32_,auVar4);
            auVar10 = vminps_avx(auVar10,auVar12);
            auVar10 = vcmpps_avx(local_2680,auVar10,2);
            auVar36 = auVar10._0_16_;
            auVar40 = auVar10._16_16_;
LAB_015095b5:
            auVar36 = vpackssdw_avx(auVar36,auVar40);
          }
          else {
            auVar39._4_4_ = fVar44;
            auVar39._0_4_ = fVar44;
            auVar39._8_4_ = fVar44;
            auVar39._12_4_ = fVar44;
            auVar39._16_4_ = fVar44;
            auVar39._20_4_ = fVar44;
            auVar39._24_4_ = fVar44;
            auVar39._28_4_ = fVar44;
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar30),auVar39,
                                      *(undefined1 (*) [32])(uVar25 + 0x40 + uVar30));
            auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar59._0_32_,auVar57._0_32_);
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar32),auVar39,
                                      *(undefined1 (*) [32])(uVar25 + 0x40 + uVar32));
            auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar61._0_32_,auVar67._0_32_);
            auVar10 = vpmaxsd_avx2(ZEXT1632(auVar36),ZEXT1632(auVar40));
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar31),auVar39,
                                      *(undefined1 (*) [32])(uVar25 + 0x40 + uVar31));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar30 ^ 0x20)),
                                      auVar39,*(undefined1 (*) [32])
                                               (uVar25 + 0x40 + (uVar30 ^ 0x20)));
            auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar59._0_32_,auVar57._0_32_);
            auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar32 ^ 0x20)),
                                      auVar39,*(undefined1 (*) [32])
                                               (uVar25 + 0x40 + (uVar32 ^ 0x20)));
            auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar61._0_32_,auVar67._0_32_);
            auVar12 = vpminsd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar58));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar31 ^ 0x20)),
                                      auVar39,*(undefined1 (*) [32])
                                               (uVar25 + 0x40 + (uVar31 ^ 0x20)));
            auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar65._0_32_,auVar69._0_32_);
            auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar65._0_32_,auVar69._0_32_);
            auVar11 = vpmaxsd_avx2(ZEXT1632(auVar36),auVar66._0_32_);
            local_2680 = vpmaxsd_avx2(auVar10,auVar11);
            auVar10 = vpminsd_avx2(ZEXT1632(auVar40),auVar34._0_32_);
            auVar10 = vpminsd_avx2(auVar12,auVar10);
            auVar10 = vcmpps_avx(local_2680,auVar10,2);
            if (uVar21 == 6) {
              auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar25 + 0x1c0),auVar39,2);
              auVar12 = vcmpps_avx(auVar39,*(undefined1 (*) [32])(uVar25 + 0x1e0),1);
              auVar11 = vandps_avx(auVar11,auVar12);
              auVar10 = vandps_avx(auVar11,auVar10);
              auVar36 = auVar10._0_16_;
              auVar40 = auVar10._16_16_;
              goto LAB_015095b5;
            }
            auVar36 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          }
          auVar36 = vpsllw_avx(auVar36,0xf);
          local_2660 = pauVar29;
          if ((((((((auVar36 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar36 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar36 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar36 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar36[0xf]) goto LAB_01509167;
          auVar36 = vpacksswb_avx(auVar36,auVar36);
          bVar9 = SUB161(auVar36 >> 7,0) & 1 | (SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar36 >> 0x17,0) & 1) << 2 | (SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar36 >> 0x27,0) & 1) << 4 | (SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar36 >> 0x37,0) & 1) << 6 | SUB161(auVar36 >> 0x3f,0) << 7;
          lVar26 = 0;
          for (uVar27 = (ulong)bVar9; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
          {
            lVar26 = lVar26 + 1;
          }
          uVar27 = *(ulong *)(uVar25 + lVar26 * 8);
          uVar21 = bVar9 - 1 & (uint)bVar9;
          uVar22 = (ulong)uVar21;
          if (uVar21 != 0) {
            uVar45 = *(uint *)(local_2680 + lVar26 * 4);
            lVar26 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar26 = lVar26 + 1;
            }
            uVar21 = uVar21 - 1 & uVar21;
            uVar23 = (ulong)uVar21;
            uVar22 = *(ulong *)(uVar25 + lVar26 * 8);
            uVar3 = *(uint *)(local_2680 + lVar26 * 4);
            if (uVar21 == 0) {
              if (uVar45 < uVar3) {
                *(ulong *)*pauVar29 = uVar22;
                *(uint *)(*pauVar29 + 8) = uVar3;
                pauVar29 = pauVar29 + 1;
              }
              else {
                *(ulong *)*pauVar29 = uVar27;
                *(uint *)(*pauVar29 + 8) = uVar45;
                uVar27 = uVar22;
                pauVar29 = pauVar29 + 1;
              }
            }
            else {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar27;
              auVar36 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar45));
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar22;
              auVar40 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar3));
              lVar26 = 0;
              for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                lVar26 = lVar26 + 1;
              }
              uVar21 = uVar21 - 1 & uVar21;
              uVar27 = (ulong)uVar21;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
              auVar47 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2680 + lVar26 * 4)));
              auVar58 = vpcmpgtd_avx(auVar40,auVar36);
              if (uVar21 == 0) {
                auVar50 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar40,auVar36,auVar50);
                auVar36 = vblendvps_avx(auVar36,auVar40,auVar50);
                auVar40 = vpcmpgtd_avx(auVar47,auVar58);
                auVar50 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar47,auVar58,auVar50);
                auVar58 = vblendvps_avx(auVar58,auVar47,auVar50);
                auVar47 = vpcmpgtd_avx(auVar58,auVar36);
                auVar50 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar58,auVar36,auVar50);
                auVar36 = vblendvps_avx(auVar36,auVar58,auVar50);
                *pauVar29 = auVar36;
                pauVar29[1] = auVar47;
                uVar27 = auVar40._0_8_;
                pauVar29 = pauVar29 + 2;
              }
              else {
                lVar26 = 0;
                for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                  lVar26 = lVar26 + 1;
                }
                uVar21 = uVar21 - 1 & uVar21;
                uVar27 = (ulong)uVar21;
                auVar48._8_8_ = 0;
                auVar48._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
                auVar50 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_2680 + lVar26 * 4)));
                if (uVar21 == 0) {
                  auVar35 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar40,auVar36,auVar35);
                  auVar36 = vblendvps_avx(auVar36,auVar40,auVar35);
                  auVar40 = vpcmpgtd_avx(auVar50,auVar47);
                  auVar35 = vpshufd_avx(auVar40,0xaa);
                  auVar40 = vblendvps_avx(auVar50,auVar47,auVar35);
                  auVar47 = vblendvps_avx(auVar47,auVar50,auVar35);
                  auVar50 = vpcmpgtd_avx(auVar47,auVar36);
                  auVar35 = vpshufd_avx(auVar50,0xaa);
                  auVar50 = vblendvps_avx(auVar47,auVar36,auVar35);
                  auVar36 = vblendvps_avx(auVar36,auVar47,auVar35);
                  auVar47 = vpcmpgtd_avx(auVar40,auVar58);
                  auVar35 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar40,auVar58,auVar35);
                  auVar40 = vblendvps_avx(auVar58,auVar40,auVar35);
                  auVar58 = vpcmpgtd_avx(auVar50,auVar40);
                  auVar35 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar50,auVar40,auVar35);
                  auVar40 = vblendvps_avx(auVar40,auVar50,auVar35);
                  *pauVar29 = auVar36;
                  pauVar29[1] = auVar40;
                  pauVar29[2] = auVar58;
                  uVar27 = auVar47._0_8_;
                  pauVar29 = pauVar29 + 3;
                }
                else {
                  *pauVar29 = auVar36;
                  pauVar29[1] = auVar40;
                  pauVar29[2] = auVar47;
                  pauVar24 = pauVar29 + 3;
                  pauVar29[3] = auVar50;
                  do {
                    lVar26 = 0;
                    for (uVar22 = uVar27; (uVar22 & 1) == 0;
                        uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      lVar26 = lVar26 + 1;
                    }
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
                    auVar36 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_2680 + lVar26 * 4)));
                    pauVar24[1] = auVar36;
                    pauVar24 = pauVar24 + 1;
                    uVar27 = uVar27 - 1 & uVar27;
                  } while (uVar27 != 0);
                  lVar26 = 0;
                  while (pauVar24 != pauVar29) {
                    auVar36 = pauVar29[1];
                    uVar21 = vextractps_avx(auVar36,2);
                    for (lVar28 = 0x10;
                        (lVar26 != lVar28 && (*(uint *)(pauVar29[-1] + lVar28 + 8) < uVar21));
                        lVar28 = lVar28 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar29 + lVar28) =
                           *(undefined1 (*) [16])(pauVar29[-1] + lVar28);
                    }
                    *(undefined1 (*) [16])(*pauVar29 + lVar28) = auVar36;
                    lVar26 = lVar26 + -0x10;
                    pauVar29 = pauVar29 + 1;
                  }
                  uVar27 = *(ulong *)*pauVar24;
                  auVar59 = ZEXT3264(local_2580);
                  auVar61 = ZEXT3264(local_25a0);
                  auVar65 = ZEXT3264(local_25c0);
                  auVar66 = ZEXT3264(local_25e0);
                  auVar57 = ZEXT3264(local_2600);
                  auVar67 = ZEXT3264(local_2620);
                  auVar69 = ZEXT3264(local_2640);
                  pauVar29 = pauVar24;
                }
              }
            }
          }
        }
        local_2660 = pauVar29;
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(uVar27 & 0xfffffffffffffff0) * 0x40))(local_23e0,ray,context);
        auVar69 = ZEXT3264(local_2640);
        auVar67 = ZEXT3264(local_2620);
        auVar57 = ZEXT3264(local_2600);
        auVar66 = ZEXT3264(local_25e0);
        auVar65 = ZEXT3264(local_25c0);
        auVar61 = ZEXT3264(local_25a0);
        auVar59 = ZEXT3264(local_2580);
        fVar44 = (ray->super_RayK<1>).tfar;
        auVar34 = ZEXT3264(CONCAT428(fVar44,CONCAT424(fVar44,CONCAT420(fVar44,CONCAT416(fVar44,
                                                  CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,
                                                  fVar44))))))));
      }
      goto LAB_01509167;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }